

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O1

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  uint inputSize;
  LZ4_stream_t *ctx;
  int iVar1;
  tableType_t tableType;
  LZ4_stream_t ctxBody;
  LZ4_stream_t_internal LStack_4048;
  
  iVar1 = 0;
  memset(&LStack_4048,0,0x4020);
  inputSize = *srcSizePtr;
  if (inputSize < 0x7e000001) {
    iVar1 = (uint)((ulong)inputSize * 0x8080808081 >> 0x27) + 0x10;
  }
  if (targetDstSize < iVar1) {
    if ((int)inputSize < 0x1000b) {
      tableType = byU16;
    }
    else {
      tableType = byU32;
    }
    iVar1 = LZ4_compress_destSize_generic(&LStack_4048,src,dst,srcSizePtr,targetDstSize,tableType);
  }
  else {
    iVar1 = LZ4_compress_fast_extState(&LStack_4048,src,dst,inputSize,targetDstSize,1);
  }
  return iVar1;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOCATOR(1, sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}